

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

void obx::internal::appendLastErrorText(obx_err err,string *outMessage)

{
  int __val;
  string *psVar1;
  char *pcVar2;
  string sStack_48;
  
  __val = obx_last_error_code();
  if (__val != err) {
    psVar1 = (string *)std::__cxx11::string::append((char *)outMessage);
    std::__cxx11::to_string(&sStack_48,err);
    std::__cxx11::string::append(psVar1);
    std::__cxx11::string::~string((string *)&sStack_48);
    if (__val != 0) {
      psVar1 = (string *)std::__cxx11::string::append((char *)outMessage);
      std::__cxx11::to_string(&sStack_48,__val);
      std::__cxx11::string::append(psVar1);
      std::__cxx11::string::~string((string *)&sStack_48);
      pcVar2 = (char *)std::__cxx11::string::append((char *)outMessage);
      obx_last_error_message();
      pcVar2 = (char *)std::__cxx11::string::append(pcVar2);
      std::__cxx11::string::append(pcVar2);
    }
    return;
  }
  if (err != 0) {
    obx_last_error_message();
    std::__cxx11::string::append((char *)outMessage);
    return;
  }
  __assert_fail("lastErr != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/build_O2/_deps/objectbox-download-src/include/objectbox.hpp"
                ,199,"void obx::internal::appendLastErrorText(obx_err, std::string &)");
}

Assistant:

void appendLastErrorText(obx_err err, std::string& outMessage) {
    obx_err lastErr = obx_last_error_code();
    if (err == lastErr) {
        assert(lastErr != 0);  // checked indirectly against err before
        outMessage += obx_last_error_message();
    } else {  // Do not use obx_last_error_message() as primary msg because it originated from another code
        outMessage.append("Error code ").append(std::to_string(err));
        if (lastErr != 0) {
            outMessage.append(" (last: ").append(std::to_string(lastErr));
            outMessage.append(", last msg: ").append(obx_last_error_message()).append(")");
        }
    }
}